

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_formatter.h
# Opt level: O0

void ST::apply_format<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
               (format_writer *data,basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *arg0)

{
  bool bVar1;
  out_of_range *this;
  wchar_t *in_RCX;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> value;
  function<void_(const_ST::format_spec_&,_ST::format_writer_&)> *local_c8;
  long local_a8;
  size_t formatter_id;
  format_spec spec;
  size_t index;
  undefined1 local_38 [8];
  formatter_ref_t formatters [1];
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *arg0_local;
  format_writer *data_local;
  
  value._M_str = in_RCX;
  value._M_len = (size_t)arg0->_M_str;
  formatters[0]._M_invoker = (_Invoker_type)arg0;
  make_formatter_ref<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
            ((formatter_ref_t *)local_38,(ST *)arg0->_M_len,value);
  spec.float_class = float_default;
  spec.pad = '\0';
  spec.always_signed = false;
  spec.class_prefix = false;
  spec.numeric_pad = false;
  while( true ) {
    bVar1 = format_writer::next_format(data);
    if (!bVar1) {
      local_c8 = (function<void_(const_ST::format_spec_&,_ST::format_writer_&)> *)
                 &formatters[0]._M_invoker;
      do {
        local_c8 = local_c8 + -1;
        std::function<void_(const_ST::format_spec_&,_ST::format_writer_&)>::~function(local_c8);
      } while (local_c8 != (function<void_(const_ST::format_spec_&,_ST::format_writer_&)> *)local_38
              );
      return;
    }
    format_writer::parse_format((format_spec *)((long)&formatter_id + 4),data);
    if (spec.minimum_length < 0) {
      local_a8._0_4_ = spec.float_class;
      local_a8._4_1_ = spec.pad;
      local_a8._5_1_ = spec.always_signed;
      local_a8._6_1_ = spec.class_prefix;
      local_a8._7_1_ = spec.numeric_pad;
      spec._20_8_ = spec._20_8_ + 1;
    }
    else {
      local_a8 = (long)(spec.minimum_length + -1);
    }
    if (local_a8 != 0) break;
    std::function<void_(const_ST::format_spec_&,_ST::format_writer_&)>::operator()
              ((function<void_(const_ST::format_spec_&,_ST::format_writer_&)> *)local_38,
               (format_spec *)((long)&formatter_id + 4),data);
  }
  this = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this,"Parameter index out of range");
  __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

void apply_format(ST::format_writer &data, arg0_T &&arg0, args_T &&...args)
    {
        enum { num_formatters = 1 + sizeof...(args) };
        formatter_ref_t formatters[num_formatters] = {
            make_formatter_ref(std::forward<arg0_T>(arg0)),
            make_formatter_ref(std::forward<args_T>(args))...
        };
        size_t index = 0;
        while (data.next_format()) {
            ST::format_spec spec = data.parse_format();
            size_t formatter_id = (spec.arg_index >= 0)
                                  ? spec.arg_index - 1
                                  : index++;
            if (formatter_id >= num_formatters)
                throw std::out_of_range("Parameter index out of range");
            formatters[formatter_id](spec, data);
        }
    }